

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O3

void InvShiftRows(AES_state *s)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  undefined1 auVar3 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ushort uVar13;
  
  auVar1 = *(undefined1 (*) [16])s->slice;
  uVar2 = auVar1._0_2_;
  uVar4 = auVar1._2_2_;
  auVar12._2_2_ = uVar4 * 2;
  auVar12._0_2_ = uVar2 * 2;
  uVar5 = auVar1._4_2_;
  auVar12._4_2_ = uVar5 * 2;
  uVar6 = auVar1._6_2_;
  auVar12._6_2_ = uVar6 * 2;
  uVar7 = auVar1._8_2_;
  auVar12._8_2_ = uVar7 * 2;
  uVar8 = auVar1._10_2_;
  auVar12._10_2_ = uVar8 * 2;
  uVar9 = auVar1._12_2_;
  uVar13 = auVar1._14_2_;
  auVar12._12_2_ = uVar9 * 2;
  auVar12._14_2_ = uVar13 * 2;
  auVar10._0_2_ = uVar2 >> 3;
  auVar10._2_2_ = uVar4 >> 3;
  auVar10._4_2_ = uVar5 >> 3;
  auVar10._6_2_ = uVar6 >> 3;
  auVar10._8_2_ = uVar7 >> 3;
  auVar10._10_2_ = uVar8 >> 3;
  auVar10._12_2_ = uVar9 >> 3;
  auVar10._14_2_ = uVar13 >> 3;
  auVar14 = psllw(auVar1,2);
  auVar11._0_2_ = uVar2 >> 2;
  auVar11._2_2_ = uVar4 >> 2;
  auVar11._4_2_ = uVar5 >> 2;
  auVar11._6_2_ = uVar6 >> 2;
  auVar11._8_2_ = uVar7 >> 2;
  auVar11._10_2_ = uVar8 >> 2;
  auVar11._12_2_ = uVar9 >> 2;
  auVar11._14_2_ = uVar13 >> 2;
  auVar15 = psllw(auVar1,3);
  auVar3._0_2_ = uVar2 >> 1;
  auVar3._2_2_ = uVar4 >> 1;
  auVar3._4_2_ = uVar5 >> 1;
  auVar3._6_2_ = uVar6 >> 1;
  auVar3._8_2_ = uVar7 >> 1;
  auVar3._10_2_ = uVar8 >> 1;
  auVar3._12_2_ = uVar9 >> 1;
  auVar3._14_2_ = uVar13 >> 1;
  *(undefined1 (*) [16])s->slice =
       auVar3 & _DAT_0058c700 | auVar15 & _DAT_0058c6f0 | auVar11 & _DAT_0058c6a0 |
       auVar14 & _DAT_0058c690 | auVar10 & _DAT_0058c6e0 |
       auVar12 & _DAT_0058c6d0 | _DAT_0058c660 & auVar1;
  return;
}

Assistant:

static void InvShiftRows(AES_state* s) {
    int i;
    for (i = 0; i < 8; i++) {
        uint16_t v = s->slice[i];
        s->slice[i] =
            (v & BIT_RANGE(0, 4)) |
            BIT_RANGE_LEFT(v, 4, 7, 1) | BIT_RANGE_RIGHT(v, 7, 8, 3) |
            BIT_RANGE_LEFT(v, 8, 10, 2) | BIT_RANGE_RIGHT(v, 10, 12, 2) |
            BIT_RANGE_LEFT(v, 12, 13, 3) | BIT_RANGE_RIGHT(v, 13, 16, 1);
    }
}